

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O3

int OPENSSL_posix_to_tm(int64_t time,tm *out_tm)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  iVar4 = 0;
  if (0xffffffb68697427f < time - 0x3afff44180U) {
    lVar7 = time % 0x15180;
    uVar2 = (uint)lVar7 + 0x15180;
    if (-1 < lVar7) {
      uVar2 = (uint)lVar7;
    }
    lVar1 = (lVar7 >> 0x3f) + time / 0x15180;
    iVar4 = (int)lVar1 + 0x8bfbc;
    if (-0xafa6c < lVar1) {
      iVar4 = (int)(time / 0x15180) + (int)(lVar7 >> 0x3f) + 0xafa6c;
    }
    lVar7 = (long)(iVar4 / 0x23ab1) * -0x23ab1 + lVar1 + 0xafa6c;
    iVar5 = (int)lVar7;
    iVar3 = (int)((ulong)((long)iVar5 * 0x4c73064f) >> 0x20) - iVar5;
    iVar9 = (int)((ulong)((long)iVar5 * 0x1a537e05) >> 0x20) - iVar5;
    iVar9 = ((iVar3 >> 10) - (iVar3 >> 0x1f)) + iVar5 +
            ((iVar9 >> 0x11) - (iVar9 >> 0x1f)) + iVar5 / 0x8eac;
    iVar3 = (int)((ulong)((long)iVar9 * 0x4c73064f) >> 0x20) - iVar9;
    lVar7 = iVar9 / 0x8e94 + lVar7 + (long)((iVar3 >> 10) - (iVar3 >> 0x1f)) +
            (long)(iVar9 / 0x16d) * -0x16d;
    iVar5 = (int)lVar7;
    iVar6 = iVar5 * 5 + (int)((ulong)((long)(iVar5 * 5 + 2) * -0x29d47f29) >> 0x20) + 2;
    iVar8 = -(iVar6 >> 0x1f);
    iVar6 = iVar6 >> 7;
    iVar3 = iVar6 + -9;
    if (lVar7 < 0x132) {
      iVar3 = iVar6 + 3;
    }
    iVar3 = iVar3 + iVar8;
    iVar6 = (int)((ulong)((long)((iVar6 + iVar8) * 0x99 + 2) * -0x66666667) >> 0x20);
    out_tm->tm_sec = (uVar2 % 0xe10) % 0x3c;
    out_tm->tm_min = (uVar2 % 0xe10) / 0x3c;
    out_tm->tm_hour = uVar2 / 0xe10;
    out_tm->tm_mday = iVar5 + ((iVar6 >> 1) - (iVar6 >> 0x1f)) + 1;
    out_tm->tm_mon = iVar3 + -1;
    out_tm->tm_year = iVar9 / 0x16d + (iVar4 / 0x23ab1) * 400 + (uint)(iVar3 < 3) + -0x76c;
    out_tm->tm_wday = 0;
    out_tm->tm_yday = 0;
    *(undefined8 *)&out_tm->tm_isdst = 0;
    out_tm->tm_gmtoff = 0;
    out_tm->tm_zone = (char *)0x0;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int OPENSSL_posix_to_tm(int64_t time, struct tm *out_tm) {
  struct tm tmp_tm = {};
  if (!utc_from_posix_time(time, &tmp_tm.tm_year, &tmp_tm.tm_mon,
                           &tmp_tm.tm_mday, &tmp_tm.tm_hour, &tmp_tm.tm_min,
                           &tmp_tm.tm_sec)) {
    return 0;
  }
  tmp_tm.tm_year -= 1900;
  tmp_tm.tm_mon -= 1;
  *out_tm = tmp_tm;

  return 1;
}